

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O1

void __thiscall QFbScreen::setDirty(QFbScreen *this,QRect *rect)

{
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  auVar1 = QRect::operator&(rect,(QRect *)(this + 0x50));
  local_20.x1.m_i = auVar1._0_4_ - *(int *)(this + 0x50);
  local_20.x2.m_i = auVar1._8_4_ - *(int *)(this + 0x50);
  local_20.y1.m_i = auVar1._4_4_ - *(int *)(this + 0x54);
  local_20.y2.m_i = auVar1._12_4_ - *(int *)(this + 0x54);
  QRegion::operator+=((QRegion *)(this + 0x38),&local_20);
  scheduleUpdate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::setDirty(const QRect &rect)
{
    const QRect intersection = rect.intersected(mGeometry);
    const QPoint screenOffset = mGeometry.topLeft();
    mRepaintRegion += intersection.translated(-screenOffset); // global to local translation
    scheduleUpdate();
}